

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O2

Aig_Man_t * Inter_ManStartOneOutput(Aig_Man_t *p,int fAddFirstPo)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int *piVar6;
  int iVar7;
  
  if (0 < p->nRegs) {
    p_00 = Aig_ManStart(p->vObjs->nSize);
    pcVar1 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar1;
    pcVar1 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar1;
    Aig_ManCleanData(p);
    p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
    piVar6 = &p->nTruePis;
    pAVar3 = (Aig_Obj_t *)0x0;
    for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCis,iVar7);
      if (iVar7 == *piVar6) {
        pAVar3 = Aig_ObjCreateCi(p_00);
      }
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar4;
    }
    if (fAddFirstPo == 0) {
      iVar7 = p->nRegs;
    }
    else {
      piVar6 = p->nObjs + 2;
      iVar7 = 0;
    }
    p_00->nRegs = iVar7;
    p_00->nTruePis = *piVar6 + 1;
    p_00->nTruePos = p->nConstrs + fAddFirstPo;
    for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    for (iVar7 = 0; iVar7 < p->nTruePos; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
      if (p->nTruePos - p->nConstrs <= iVar7) {
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)pAVar4 ^ 1));
      }
    }
    if (fAddFirstPo == 0) {
      for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar7);
        pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar7);
        pAVar4 = *(Aig_Obj_t **)((long)pvVar2 + 0x28);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        pAVar4 = Aig_Mux(p_00,pAVar3,pAVar4,pAVar5);
        Aig_ObjCreateCo(p_00,pAVar4);
      }
    }
    else {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,0);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjCreateCo(p_00,pAVar3);
    }
    Aig_ManCleanup(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intDup.c"
                ,0x80,"Aig_Man_t *Inter_ManStartOneOutput(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Inter_ManStartOneOutput( Aig_Man_t * p, int fAddFirstPo )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pCtrl = NULL; // Suppress "might be used uninitialized"
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( i == Saig_ManPiNum(p) )
            pCtrl = Aig_ObjCreateCi( pNew );
        pObj->pData = Aig_ObjCreateCi( pNew );
    }
    // set registers
    pNew->nRegs    = fAddFirstPo? 0 : p->nRegs;
    pNew->nTruePis = fAddFirstPo? Aig_ManCiNum(p) + 1 : p->nTruePis + 1;
    pNew->nTruePos = fAddFirstPo + Saig_ManConstrNum(p);
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // create constraint outputs
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            continue;
        Aig_ObjCreateCo( pNew, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
    }

    // add the PO
    if ( fAddFirstPo )
    {
        pObj = Aig_ManCo( p, 0 );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    else
    {
        // create register inputs with MUXes
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        {
            pObj = Aig_Mux( pNew, pCtrl, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
    //        pObj = Aig_Mux( pNew, pCtrl, Aig_ManConst0(pNew), Aig_ObjChild0Copy(pObjLi) );
            Aig_ObjCreateCo( pNew, pObj );
        }
    }
    Aig_ManCleanup( pNew );
    return pNew;
}